

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  uint uVar1;
  long ***ppplVar2;
  long ***ppplVar3;
  ssize_t sVar4;
  watcher_list *w;
  char *pcVar5;
  long ****pppplVar6;
  int *piVar7;
  int *piVar8;
  void **ppvVar9;
  long ***local_1068;
  long **local_1060 [2];
  int *local_1050;
  uv_loop_t *local_1048;
  int *local_1040;
  char buf [4096];
  
  local_1048 = loop;
  while( true ) {
    while( true ) {
      sVar4 = read(loop->inotify_fd,buf,0x1000);
      if (sVar4 != -1) break;
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        if (*piVar7 == 0xb) {
          return;
        }
        __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-inotify.c"
                      ,0xbb,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
      }
    }
    if (sVar4 < 1) break;
    local_1040 = (int *)(buf + sVar4);
    for (piVar7 = (int *)buf; piVar7 < local_1040;
        piVar7 = (int *)((long)piVar7 + (ulong)(uint)piVar7[3] + 0x10)) {
      uVar1 = piVar7[1];
      w = find_watcher(loop,*piVar7);
      if (w != (watcher_list *)0x0) {
        if (piVar7[3] == 0) {
          local_1050 = (int *)w->path;
          pcVar5 = strrchr((char *)local_1050,0x2f);
          piVar8 = (int *)(pcVar5 + 1);
          if (pcVar5 == (char *)0x0) {
            piVar8 = local_1050;
          }
        }
        else {
          piVar8 = piVar7 + 4;
        }
        w->iterating = 1;
        ppvVar9 = w->watchers;
        local_1068 = (long ***)w->watchers[0];
        if ((long ***)ppvVar9 == local_1068) {
          pppplVar6 = (long ****)local_1060;
          local_1068 = (long ***)&local_1068;
        }
        else {
          local_1060[0] = (long **)w->watchers[1];
          *local_1060[0] = (long *)&local_1068;
          ppplVar2 = ((long ****)local_1068)[1];
          pppplVar6 = (long ****)local_1068 + 1;
          w->watchers[1] = ppplVar2;
          *ppplVar2 = (long **)ppvVar9;
        }
        *pppplVar6 = (long ***)&local_1068;
        while (loop = local_1048, ppplVar2 = local_1068, &local_1068 != (long ****)local_1068) {
          pppplVar6 = (long ****)(local_1068 + -0xe);
          ppplVar3 = (long ***)*local_1068;
          *local_1068[1] = (long *)ppplVar3;
          ppplVar3[1] = local_1068[1];
          *local_1068 = (long **)ppvVar9;
          ppplVar3 = (long ***)w->watchers[1];
          ppplVar2[1] = (long **)ppplVar3;
          *ppplVar3 = (long **)ppplVar2;
          w->watchers[1] = ppplVar2;
          (*(code *)ppplVar2[-1])
                    (pppplVar6,piVar8,((uVar1 & 0xfffffff9) != 0) + ((uVar1 & 6) != 0) * '\x02',0);
        }
        w->iterating = 0;
        maybe_free_watcher_list(w,local_1048);
      }
    }
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/linux-inotify.c"
                ,0xbf,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  QUEUE queue;
  QUEUE* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use QUEUE_MOVE() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      QUEUE_MOVE(&w->watchers, &queue);
      while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        h = QUEUE_DATA(q, uv_fs_event_t, watchers);

        QUEUE_REMOVE(q);
        QUEUE_INSERT_TAIL(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}